

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O0

ConfigType helics::fileops::getConfigType(string_view configString)

{
  string_view testString;
  string_view tomlString;
  string_view jsonString;
  bool bVar1;
  const_reference pvVar2;
  char *in_RSI;
  char *in_RDI;
  string_view in_stack_00000028;
  char *in_stack_ffffffffffffff98;
  char *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ConfigType CVar3;
  
  local_18 = in_RDI;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
  if (bVar1) {
    CVar3 = NONE;
  }
  else {
    pvVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
    if (*pvVar2 == '-') {
      CVar3 = CMD_LINE;
    }
    else {
      bVar1 = hasJsonExtension(in_stack_00000028);
      if (bVar1) {
        CVar3 = JSON_FILE;
      }
      else {
        bVar1 = hasTomlExtension(in_stack_00000028);
        if (bVar1) {
          CVar3 = TOML_FILE;
        }
        else {
          jsonString._M_str._0_4_ = in_stack_fffffffffffffff8;
          jsonString._M_len = (size_t)in_RSI;
          jsonString._M_str._4_4_ = in_stack_fffffffffffffffc;
          bVar1 = looksLikeConfigJson(jsonString);
          if (bVar1) {
            CVar3 = JSON_STRING;
          }
          else {
            testString._M_str = in_stack_ffffffffffffff98;
            testString._M_len = 0x7146fc;
            bVar1 = looksLikeCommandLine(testString);
            if (bVar1) {
              CVar3 = CMD_LINE;
            }
            else {
              tomlString._M_str = local_18;
              tomlString._M_len = 0x71472d;
              bVar1 = looksLikeConfigToml(tomlString);
              if (bVar1) {
                CVar3 = TOML_STRING;
              }
              else {
                CVar3 = NONE;
              }
            }
          }
        }
      }
    }
  }
  return CVar3;
}

Assistant:

ConfigType getConfigType(std::string_view configString)
{
    if (configString.empty()) {
        return ConfigType::NONE;
    }
    if (configString.front() == '-') {
        return ConfigType::CMD_LINE;
    }
    if (fileops::hasJsonExtension(configString)) {
        return ConfigType::JSON_FILE;
    }
    if (fileops::hasTomlExtension(configString)) {
        return ConfigType::TOML_FILE;
    }
    if (fileops::looksLikeConfigJson(configString)) {
        return ConfigType::JSON_STRING;
    }
    if (fileops::looksLikeCommandLine(configString)) {
        return ConfigType::CMD_LINE;
    }
    if (fileops::looksLikeConfigToml(configString)) {
        return ConfigType::TOML_STRING;
    }
    return ConfigType::NONE;
}